

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

IterateResult __thiscall gl3cts::InvalidVSInputsTest::iterate(InvalidVSInputsTest *this)

{
  ostringstream *this_00;
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  bool bVar5;
  char *pcVar6;
  _test_iteration iteration;
  GLint compile_status;
  char *body_raw_ptr;
  string body;
  string local_1d0;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  pcVar6 = "glCreateShader() call failed.";
  glu::checkError(dVar3,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x57d);
  bVar5 = true;
  this_00 = (ostringstream *)(local_1b0 + 8);
  for (iteration = TEST_ITERATION_FIRST; iteration != TEST_ITERATION_COUNT;
      iteration = iteration + TEST_ITERATION_INVALID_BVEC2_INPUT) {
    getShaderBody_abi_cxx11_(&body,(InvalidVSInputsTest *)pcVar6,iteration);
    body_raw_ptr = body._M_dataplus._M_p;
    compile_status = 0;
    (**(code **)(lVar4 + 0x12b8))(this->m_vs_id,1,&body_raw_ptr,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x58a);
    (**(code **)(lVar4 + 0x248))(this->m_vs_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x58e);
    (**(code **)(lVar4 + 0xa70))(this->m_vs_id,0x8b81,&compile_status);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    pcVar6 = "glGetShaderiv() call failed.";
    glu::checkError(dVar3,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x591);
    if (compile_status == 1) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      pcVar6 = "The following vertex shader, used for test iteration [";
      std::operator<<((ostream *)this_00,"The following vertex shader, used for test iteration [");
      getIterationName_abi_cxx11_(&local_1d0,(InvalidVSInputsTest *)pcVar6,iteration);
      std::operator<<((ostream *)this_00,(string *)&local_1d0);
      std::operator<<((ostream *)this_00,
                      "] was compiled successfully, even though it is invalid. Body:\n>>\n");
      std::operator<<((ostream *)this_00,(string *)&body);
      std::operator<<((ostream *)this_00,"\n<<\n");
      pcVar6 = &tcu::TestLog::EndMessage;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      bVar5 = false;
    }
    std::__cxx11::string::~string((string *)&body);
  }
  pcVar6 = "Fail";
  if (bVar5) {
    pcVar6 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar5 & QP_TEST_RESULT_FAIL,pcVar6);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InvalidVSInputsTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Create a vertex shader object */
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Execute all test iterations.. */
	for (int current_iteration = static_cast<int>(TEST_ITERATION_FIRST);
		 current_iteration < static_cast<int>(TEST_ITERATION_COUNT); current_iteration++)
	{
		const std::string body			 = getShaderBody(static_cast<_test_iteration>(current_iteration));
		const char*		  body_raw_ptr   = body.c_str();
		glw::GLint		  compile_status = GL_FALSE;

		/* Assign the source code to the SO */
		gl.shaderSource(m_vs_id, 1,				 /* count */
						&body_raw_ptr, DE_NULL); /* length */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

		/* Try to compile the shader object. */
		gl.compileShader(m_vs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "The following vertex shader, used for test iteration ["
							   << getIterationName(static_cast<_test_iteration>(current_iteration))
							   << "] "
								  "was compiled successfully, even though it is invalid. Body:"
								  "\n>>\n"
							   << body << "\n<<\n"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all test iterations) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}